

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall QFont::QFont(QFont *this,QStringList *families,int pointSize,int weight,bool italic)

{
  uint uVar1;
  QFontPrivate *pQVar2;
  ulong uVar3;
  ulong uVar4;
  qreal local_38;
  
  pQVar2 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar2);
  (this->d).d.ptr = pQVar2;
  LOCK();
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  this->resolve_mask = 0x20000;
  if (pointSize < 1) {
    local_38 = 12.0;
    uVar1 = 0x20000;
  }
  else {
    this->resolve_mask = 0x20002;
    local_38 = (qreal)pointSize;
    uVar1 = 0x20002;
  }
  if (weight < 0) {
    uVar4 = 0x1900000000000;
  }
  else {
    uVar1 = uVar1 | 0x30;
    this->resolve_mask = uVar1;
    uVar4 = (ulong)(weight & 0x3ff) << 0x28;
  }
  if (italic) {
    this->resolve_mask = uVar1 | 0x20;
    uVar3 = 0x10000000;
  }
  else {
    uVar3 = 0;
  }
  QArrayDataPointer<QString>::operator=
            ((QArrayDataPointer<QString> *)&((this->d).d.ptr)->request,&families->d);
  pQVar2 = (this->d).d.ptr;
  (pQVar2->request).pointSize = local_38;
  (pQVar2->request).pixelSize = -1.0;
  *(ulong *)&(pQVar2->request).field_0x60 =
       *(ulong *)&(pQVar2->request).field_0x60 & 0xfffc00ffffffffff | uVar4;
  pQVar2 = (this->d).d.ptr;
  *(ulong *)&(pQVar2->request).field_0x60 =
       *(ulong *)&(pQVar2->request).field_0x60 & 0xffffffffcfffffff | uVar3;
  return;
}

Assistant:

QFont::QFont(const QStringList &families, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0)
        pointSize = 12;
    else
        resolve_mask |= QFont::SizeResolved;

    if (weight < 0)
        weight = Normal;
    else
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = families;
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}